

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O0

void __thiscall MemTable::MemTable(MemTable *this,MemTable *m)

{
  MemTable *m_local;
  MemTable *this_local;
  
  Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Dictionary(&this->
                super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
  (this->
  super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_Dictionary = (_func_int **)&PTR_size_0012bc48;
  std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::list
            (&this->qlist);
  this->_size = 0;
  this->_size_bytes = 0;
  std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::
  operator=(&this->qlist,&m->qlist);
  this->_size_bytes = m->_size_bytes;
  this->_size = m->_size;
  m->_size_bytes = 0;
  m->_size = 0;
  return;
}

Assistant:

MemTable::MemTable(MemTable &&m) noexcept {
    qlist = std::move(m.qlist);
    _size_bytes = m._size_bytes;
    _size = m._size;
    m._size_bytes = 0;
    m._size = 0;
}